

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall
cmake::AddCacheEntry(cmake *this,string *key,cmValue value,cmValue helpString,int type)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var1;
  cmValue value_00;
  bool bVar2;
  pointer this_00;
  string *helpString_00;
  pointer pcVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  bool local_131;
  bool local_111;
  int type_local;
  string *key_local;
  cmake *this_local;
  cmValue helpString_local;
  cmValue value_local;
  
  this_local = (cmake *)helpString.Value;
  helpString_local = value;
  this_00 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
  value_00 = helpString_local;
  helpString_00 = cmValue::operator_cast_to_string_((cmValue *)&this_local);
  cmState::AddCacheEntry(this_00,key,value_00,helpString_00,type);
  UnwatchUnusedCli(this,key);
  _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)key);
  bVar4 = (basic_string_view<char,_std::char_traits<char>_>)
          ::cm::operator____s("CMAKE_WARN_DEPRECATED",0x15);
  bVar2 = std::operator==(_Var1,bVar4);
  if (bVar2) {
    pcVar3 = std::unique_ptr<cmMessenger,_std::default_delete<cmMessenger>_>::operator->
                       (&this->Messenger);
    bVar2 = cmValue::operator_cast_to_bool(&helpString_local);
    local_111 = false;
    if (bVar2) {
      local_111 = cmValue::IsOff(&helpString_local);
    }
    cmMessenger::SetSuppressDeprecatedWarnings(pcVar3,local_111);
  }
  else {
    _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)key);
    bVar4 = (basic_string_view<char,_std::char_traits<char>_>)
            ::cm::operator____s("CMAKE_ERROR_DEPRECATED",0x16);
    bVar2 = std::operator==(_Var1,bVar4);
    if (bVar2) {
      pcVar3 = std::unique_ptr<cmMessenger,_std::default_delete<cmMessenger>_>::operator->
                         (&this->Messenger);
      bVar2 = cmValue::IsOn(&helpString_local);
      cmMessenger::SetDeprecatedWarningsAsErrors(pcVar3,bVar2);
    }
    else {
      _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)key);
      bVar4 = (basic_string_view<char,_std::char_traits<char>_>)
              ::cm::operator____s("CMAKE_SUPPRESS_DEVELOPER_WARNINGS",0x21);
      bVar2 = std::operator==(_Var1,bVar4);
      if (bVar2) {
        pcVar3 = std::unique_ptr<cmMessenger,_std::default_delete<cmMessenger>_>::operator->
                           (&this->Messenger);
        bVar2 = cmValue::IsOn(&helpString_local);
        cmMessenger::SetSuppressDevWarnings(pcVar3,bVar2);
      }
      else {
        _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)key);
        bVar4 = (basic_string_view<char,_std::char_traits<char>_>)
                ::cm::operator____s("CMAKE_SUPPRESS_DEVELOPER_ERRORS",0x1f);
        bVar2 = std::operator==(_Var1,bVar4);
        if (bVar2) {
          pcVar3 = std::unique_ptr<cmMessenger,_std::default_delete<cmMessenger>_>::operator->
                             (&this->Messenger);
          bVar2 = cmValue::operator_cast_to_bool(&helpString_local);
          local_131 = false;
          if (bVar2) {
            local_131 = cmValue::IsOff(&helpString_local);
          }
          cmMessenger::SetDevWarningsAsErrors(pcVar3,local_131);
        }
      }
    }
  }
  return;
}

Assistant:

void cmake::AddCacheEntry(const std::string& key, cmValue value,
                          cmValue helpString, int type)
{
  this->State->AddCacheEntry(key, value, helpString,
                             static_cast<cmStateEnums::CacheEntryType>(type));
  this->UnwatchUnusedCli(key);

  if (key == "CMAKE_WARN_DEPRECATED"_s) {
    this->Messenger->SetSuppressDeprecatedWarnings(value && value.IsOff());
  } else if (key == "CMAKE_ERROR_DEPRECATED"_s) {
    this->Messenger->SetDeprecatedWarningsAsErrors(value.IsOn());
  } else if (key == "CMAKE_SUPPRESS_DEVELOPER_WARNINGS"_s) {
    this->Messenger->SetSuppressDevWarnings(value.IsOn());
  } else if (key == "CMAKE_SUPPRESS_DEVELOPER_ERRORS"_s) {
    this->Messenger->SetDevWarningsAsErrors(value && value.IsOff());
  }
}